

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int m_split_fs(aec_stream_conflict *strm)

{
  int iVar1;
  internal_state_conflict *piVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  
  piVar2 = strm->state;
  iVar1 = piVar2->id;
  iVar8 = piVar2->bitp;
  do {
    if (iVar8 < 1) {
      sVar10 = strm->avail_in;
      iVar7 = iVar8;
      do {
        sVar10 = sVar10 - 1;
        if (sVar10 == 0xffffffffffffffff) {
          return 0;
        }
        strm->avail_in = sVar10;
        uVar6 = piVar2->acc << 8;
        piVar2->acc = uVar6;
        pbVar3 = strm->next_in;
        strm->next_in = pbVar3 + 1;
        uVar6 = *pbVar3 | uVar6;
        piVar2->acc = uVar6;
        iVar8 = iVar7 + 8;
        piVar2->bitp = iVar8;
        bVar4 = iVar7 < -7;
        iVar7 = iVar8;
      } while (bVar4);
    }
    else {
      uVar6 = piVar2->acc;
    }
    if ((uVar6 >> ((ulong)(byte)((char)iVar8 - 1) & 0x3f) & 1) == 0) {
      do {
        iVar7 = iVar8;
        if (iVar8 == 1) {
          if (strm->avail_in == 0) {
            return 0;
          }
          strm->avail_in = strm->avail_in - 1;
          piVar2->acc = uVar6 << 8;
          pbVar3 = strm->next_in;
          strm->next_in = pbVar3 + 1;
          uVar6 = uVar6 << 8 | (ulong)*pbVar3;
          piVar2->acc = uVar6;
          iVar7 = 9;
        }
        iVar9 = piVar2->fs + 1;
        piVar2->fs = iVar9;
        iVar8 = iVar7 + -1;
        piVar2->bitp = iVar8;
      } while ((uVar6 >> ((ulong)(byte)((char)iVar7 - 2) & 0x3f) & 1) == 0);
    }
    else {
      iVar9 = piVar2->fs;
    }
    piVar2->rsip[piVar2->sample_counter] = iVar9 << ((char)iVar1 - 1U & 0x1f);
    piVar2->fs = 0;
    iVar8 = piVar2->bitp + -1;
    piVar2->bitp = iVar8;
    uVar5 = piVar2->sample_counter + 1;
    piVar2->sample_counter = uVar5;
  } while (uVar5 < piVar2->encoded_block_size);
  piVar2->sample_counter = 0;
  piVar2->mode = m_split_output;
  return 1;
}

Assistant:

static int m_split_fs(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;
    int k = state->id - 1;

    do {
        if (fs_ask(strm) == 0)
            return M_EXIT;
        state->rsip[state->sample_counter] = state->fs << k;
        fs_drop(strm);
    } while(++state->sample_counter < state->encoded_block_size);

    state->sample_counter = 0;
    state->mode = m_split_output;

    return M_CONTINUE;
}